

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O1

void __thiscall xe::TestResultParser::handleData(TestResultParser *this)

{
  uchar uVar1;
  pointer ppIVar2;
  size_type sVar3;
  Type TVar4;
  size_type *psVar5;
  uchar *puVar6;
  byte *pbVar7;
  runtime_error *prVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  Item *pIVar13;
  byte bVar14;
  Item *pIVar15;
  uint uVar16;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  Item *local_38;
  
  ppIVar2 = (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
      _M_impl.super__Vector_impl_data._M_start == ppIVar2) {
    pIVar13 = (Item *)0x0;
  }
  else {
    pIVar13 = ppIVar2[-1];
  }
  if (pIVar13 == (Item *)0x0) {
    TVar4 = TYPE_LAST;
  }
  else {
    TVar4 = pIVar13->m_type;
  }
  switch(TVar4) {
  case TYPE_RESULT:
    pIVar15 = pIVar13 + 1;
    if ((this->m_xmlParser).m_state == STATE_ENTITY) {
LAB_00120ad8:
      std::__cxx11::string::_M_append
                ((char *)pIVar15,(ulong)(this->m_xmlParser).m_entityValue._M_dataplus._M_p);
      return;
    }
    lVar10 = *(long *)&pIVar13[1].m_type;
    std::__cxx11::string::resize
              ((ulong)pIVar15,(char)(this->m_xmlParser).m_tokenizer.m_curTokenLen + (char)lVar10);
    if (0 < (this->m_xmlParser).m_tokenizer.m_curTokenLen) {
      lVar11 = 0;
      do {
        *(uchar *)((long)pIVar15->_vptr_Item + lVar11 + lVar10) =
             (this->m_xmlParser).m_tokenizer.m_buf.m_buffer
             [((this->m_xmlParser).m_tokenizer.m_buf.m_back + (int)lVar11) %
              (this->m_xmlParser).m_tokenizer.m_buf.m_size];
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->m_xmlParser).m_tokenizer.m_curTokenLen);
    }
    break;
  case TYPE_TEXT:
    pIVar15 = pIVar13 + 1;
    if ((this->m_xmlParser).m_state == STATE_ENTITY) goto LAB_00120ad8;
    lVar10 = *(long *)&pIVar13[1].m_type;
    std::__cxx11::string::resize
              ((ulong)pIVar15,(char)(this->m_xmlParser).m_tokenizer.m_curTokenLen + (char)lVar10);
    if (0 < (this->m_xmlParser).m_tokenizer.m_curTokenLen) {
      lVar11 = 0;
      do {
        *(uchar *)((long)pIVar15->_vptr_Item + lVar11 + lVar10) =
             (this->m_xmlParser).m_tokenizer.m_buf.m_buffer
             [((this->m_xmlParser).m_tokenizer.m_buf.m_back + (int)lVar11) %
              (this->m_xmlParser).m_tokenizer.m_buf.m_size];
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->m_xmlParser).m_tokenizer.m_curTokenLen);
    }
    break;
  case TYPE_NUMBER:
  case TYPE_SAMPLEVALUE:
    pIVar15 = (Item *)&this->m_curNumValue;
    if ((this->m_xmlParser).m_state == STATE_ENTITY) goto LAB_00120ad8;
    sVar3 = (this->m_curNumValue)._M_string_length;
    std::__cxx11::string::resize
              ((ulong)pIVar15,(char)(this->m_xmlParser).m_tokenizer.m_curTokenLen + (char)sVar3);
    if (0 < (this->m_xmlParser).m_tokenizer.m_curTokenLen) {
      lVar10 = 0;
      do {
        (this->m_curNumValue)._M_dataplus._M_p[lVar10 + sVar3] =
             (this->m_xmlParser).m_tokenizer.m_buf.m_buffer
             [((this->m_xmlParser).m_tokenizer.m_buf.m_back + (int)lVar10) %
              (this->m_xmlParser).m_tokenizer.m_buf.m_size];
        lVar10 = lVar10 + 1;
      } while (lVar10 < (this->m_xmlParser).m_tokenizer.m_curTokenLen);
    }
    break;
  case TYPE_IMAGE:
    psVar5 = (size_type *)&(this->m_xmlParser).m_tokenizer.m_curTokenLen;
    if ((this->m_xmlParser).m_state == STATE_ENTITY) {
      psVar5 = &(this->m_xmlParser).m_entityValue._M_string_length;
    }
    sVar3 = *psVar5;
    if (0 < (int)(uint)sVar3) {
      local_38 = pIVar13 + 6;
      uVar12 = 0;
      do {
        if ((this->m_xmlParser).m_state == STATE_ENTITY) {
          puVar6 = (uchar *)((this->m_xmlParser).m_entityValue._M_dataplus._M_p + uVar12);
        }
        else {
          puVar6 = (this->m_xmlParser).m_tokenizer.m_buf.m_buffer +
                   ((this->m_xmlParser).m_tokenizer.m_buf.m_back + (int)uVar12) %
                   (this->m_xmlParser).m_tokenizer.m_buf.m_size;
        }
        uVar1 = *puVar6;
        if ((byte)(uVar1 + 0xbf) < 0x1a) {
          bVar14 = uVar1 + 0xbf;
LAB_0012091f:
          uVar16 = this->m_base64DecodeOffset % 4;
          if (uVar16 == 0) {
            local_58[0] = (undefined1 *)((ulong)local_58[0] & 0xffffffffffffff00);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                       (*(long *)&pIVar13[6].m_type - (long)pIVar13[6]._vptr_Item) + 3,
                       (value_type_conflict1 *)local_58);
          }
          iVar9 = this->m_base64DecodeOffset >> 2;
          if ((int)(pIVar13[6].m_type - (int)pIVar13[6]._vptr_Item) < iVar9 * 3 + 3) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_58[0] = local_48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_58,"Malformed base64 data","");
            std::runtime_error::runtime_error(prVar8,(string *)local_58);
            *(undefined ***)prVar8 = &PTR__runtime_error_001375c0;
            __cxa_throw(prVar8,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (uVar16 < 4) {
            pbVar7 = (byte *)((long)pIVar13[6]._vptr_Item + (long)(iVar9 * 3));
            switch(uVar16) {
            case 0:
              bVar14 = bVar14 << 2;
              break;
            case 1:
              *pbVar7 = *pbVar7 | bVar14 >> 4;
              bVar14 = bVar14 << 4;
              pbVar7 = pbVar7 + 1;
              break;
            case 2:
              pbVar7[1] = pbVar7[1] | bVar14 >> 2;
              bVar14 = bVar14 << 6;
            case 3:
              pbVar7 = pbVar7 + 2;
            }
            *pbVar7 = *pbVar7 | bVar14;
          }
          this->m_base64DecodeOffset = this->m_base64DecodeOffset + 1;
        }
        else {
          if ((byte)(uVar1 + 0x9f) < 0x1a) {
            bVar14 = uVar1 + 0xb9;
            goto LAB_0012091f;
          }
          if ((byte)(uVar1 - 0x30) < 10) {
            bVar14 = uVar1 + 4;
            goto LAB_0012091f;
          }
          if (uVar1 == '+') {
            bVar14 = 0x3e;
            goto LAB_0012091f;
          }
          if (uVar1 == '=') {
            if (pIVar13[6]._vptr_Item == *(_func_int ***)&pIVar13[6].m_type) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_58[0] = local_48;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_58,"Malformed base64 data","");
              std::runtime_error::runtime_error(prVar8,(string *)local_58);
              *(undefined ***)prVar8 = &PTR__runtime_error_001375c0;
              __cxa_throw(prVar8,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error)
              ;
            }
            *(long *)&pIVar13[6].m_type = (long)*(_func_int ***)&pIVar13[6].m_type + -1;
          }
          else if (uVar1 == '/') {
            bVar14 = 0x3f;
            goto LAB_0012091f;
          }
        }
        uVar12 = uVar12 + 1;
      } while ((uint)sVar3 != uVar12);
    }
    break;
  case TYPE_SHADERSOURCE:
    pIVar15 = pIVar13 + 1;
    if ((this->m_xmlParser).m_state == STATE_ENTITY) goto LAB_00120ad8;
    lVar10 = *(long *)&pIVar13[1].m_type;
    std::__cxx11::string::resize
              ((ulong)pIVar15,(char)(this->m_xmlParser).m_tokenizer.m_curTokenLen + (char)lVar10);
    if (0 < (this->m_xmlParser).m_tokenizer.m_curTokenLen) {
      lVar11 = 0;
      do {
        *(uchar *)((long)pIVar15->_vptr_Item + lVar11 + lVar10) =
             (this->m_xmlParser).m_tokenizer.m_buf.m_buffer
             [((this->m_xmlParser).m_tokenizer.m_buf.m_back + (int)lVar11) %
              (this->m_xmlParser).m_tokenizer.m_buf.m_size];
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->m_xmlParser).m_tokenizer.m_curTokenLen);
    }
    break;
  case TYPE_SPIRVSOURCE:
    pIVar15 = pIVar13 + 1;
    if ((this->m_xmlParser).m_state == STATE_ENTITY) goto LAB_00120ad8;
    lVar10 = *(long *)&pIVar13[1].m_type;
    std::__cxx11::string::resize
              ((ulong)pIVar15,(char)(this->m_xmlParser).m_tokenizer.m_curTokenLen + (char)lVar10);
    if (0 < (this->m_xmlParser).m_tokenizer.m_curTokenLen) {
      lVar11 = 0;
      do {
        *(uchar *)((long)pIVar15->_vptr_Item + lVar11 + lVar10) =
             (this->m_xmlParser).m_tokenizer.m_buf.m_buffer
             [((this->m_xmlParser).m_tokenizer.m_buf.m_back + (int)lVar11) %
              (this->m_xmlParser).m_tokenizer.m_buf.m_size];
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->m_xmlParser).m_tokenizer.m_curTokenLen);
    }
    break;
  case TYPE_INFOLOG:
    pIVar15 = pIVar13 + 1;
    if ((this->m_xmlParser).m_state == STATE_ENTITY) goto LAB_00120ad8;
    lVar10 = *(long *)&pIVar13[1].m_type;
    std::__cxx11::string::resize
              ((ulong)pIVar15,(char)(this->m_xmlParser).m_tokenizer.m_curTokenLen + (char)lVar10);
    if (0 < (this->m_xmlParser).m_tokenizer.m_curTokenLen) {
      lVar11 = 0;
      do {
        *(uchar *)((long)pIVar15->_vptr_Item + lVar11 + lVar10) =
             (this->m_xmlParser).m_tokenizer.m_buf.m_buffer
             [((this->m_xmlParser).m_tokenizer.m_buf.m_back + (int)lVar11) %
              (this->m_xmlParser).m_tokenizer.m_buf.m_size];
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->m_xmlParser).m_tokenizer.m_curTokenLen);
    }
    break;
  case TYPE_KERNELSOURCE:
    pIVar15 = pIVar13 + 1;
    if ((this->m_xmlParser).m_state == STATE_ENTITY) goto LAB_00120ad8;
    lVar10 = *(long *)&pIVar13[1].m_type;
    std::__cxx11::string::resize
              ((ulong)pIVar15,(char)(this->m_xmlParser).m_tokenizer.m_curTokenLen + (char)lVar10);
    if (0 < (this->m_xmlParser).m_tokenizer.m_curTokenLen) {
      lVar11 = 0;
      do {
        *(uchar *)((long)pIVar15->_vptr_Item + lVar11 + lVar10) =
             (this->m_xmlParser).m_tokenizer.m_buf.m_buffer
             [((this->m_xmlParser).m_tokenizer.m_buf.m_back + (int)lVar11) %
              (this->m_xmlParser).m_tokenizer.m_buf.m_size];
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->m_xmlParser).m_tokenizer.m_curTokenLen);
    }
  }
  return;
}

Assistant:

void TestResultParser::handleData (void)
{
	ri::Item*	curItem		= getCurrentItem();
	ri::Type	type		= curItem ? curItem->getType() : ri::TYPE_LAST;

	switch (type)
	{
		case ri::TYPE_RESULT:
			m_xmlParser.appendDataStr(static_cast<ri::Result*>(curItem)->details);
			break;

		case ri::TYPE_TEXT:
			m_xmlParser.appendDataStr(static_cast<ri::Text*>(curItem)->text);
			break;

		case ri::TYPE_SHADERSOURCE:
			m_xmlParser.appendDataStr(static_cast<ri::ShaderSource*>(curItem)->source);
			break;

		case ri::TYPE_SPIRVSOURCE:
			m_xmlParser.appendDataStr(static_cast<ri::SpirVSource*>(curItem)->source);
			break;

		case ri::TYPE_INFOLOG:
			m_xmlParser.appendDataStr(static_cast<ri::InfoLog*>(curItem)->log);
			break;

		case ri::TYPE_KERNELSOURCE:
			m_xmlParser.appendDataStr(static_cast<ri::KernelSource*>(curItem)->source);
			break;

		case ri::TYPE_NUMBER:
		case ri::TYPE_SAMPLEVALUE:
			m_xmlParser.appendDataStr(m_curNumValue);
			break;

		case ri::TYPE_IMAGE:
		{
			ri::Image* image = static_cast<ri::Image*>(curItem);

			// Base64 decode.
			int numBytesIn = m_xmlParser.getDataSize();

			for (int inNdx = 0; inNdx < numBytesIn; inNdx++)
			{
				deUint8		byte		= m_xmlParser.getDataByte(inNdx);
				deUint8		decodedBits	= 0;

				if (de::inRange<deInt8>(byte, 'A', 'Z'))
					decodedBits = (deUint8)(byte - 'A');
				else if (de::inRange<deInt8>(byte, 'a', 'z'))
					decodedBits = (deUint8)(('Z'-'A'+1) + (byte-'a'));
				else if (de::inRange<deInt8>(byte, '0', '9'))
					decodedBits = (deUint8)(('Z'-'A'+1) + ('z'-'a'+1) + (byte-'0'));
				else if (byte == '+')
					decodedBits = ('Z'-'A'+1) + ('z'-'a'+1) + ('9'-'0'+1);
				else if (byte == '/')
					decodedBits = ('Z'-'A'+1) + ('z'-'a'+1) + ('9'-'0'+2);
				else if (byte == '=')
				{
					// Padding at end - remove last byte.
					if (image->data.empty())
						throw TestResultParseError("Malformed base64 data");
					image->data.pop_back();
					continue;
				}
				else
					continue; // Not an B64 input character.

				int phase = m_base64DecodeOffset % 4;

				if (phase == 0)
					image->data.resize(image->data.size()+3, 0);

				if ((int)image->data.size() < (m_base64DecodeOffset>>2)*3 + 3)
					throw TestResultParseError("Malformed base64 data");
				deUint8* outPtr = &image->data[(m_base64DecodeOffset>>2)*3];

				switch (phase)
				{
					case 0: outPtr[0] |= (deUint8)(decodedBits<<2);													break;
					case 1: outPtr[0] |= (deUint8)(decodedBits>>4);	outPtr[1] |= (deUint8)((decodedBits&0xF)<<4);	break;
					case 2: outPtr[1] |= (deUint8)(decodedBits>>2);	outPtr[2] |= (deUint8)((decodedBits&0x3)<<6);	break;
					case 3: outPtr[2] |= decodedBits;																break;
					default:
						DE_ASSERT(false);
				}

				m_base64DecodeOffset += 1;
			}

			break;
		}

		default:
			// Just ignore data.
			break;
	}
}